

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O0

error_t ArgumentHandlers::BNB_parse_argument(int key,char *arg,argp_state *state)

{
  long lVar1;
  int iVar2;
  long in_RDX;
  char *in_RSI;
  int in_EDI;
  Arguments *theArgumentsStruc;
  
  lVar1 = *(long *)(in_RDX + 0x28);
  if (in_EDI == 1) {
    *(undefined1 *)(lVar1 + 0x20c) = 1;
  }
  else if (in_EDI == 2) {
    iVar2 = strcmp(in_RSI,"Id");
    if (iVar2 == 0) {
      *(undefined4 *)(lVar1 + 0x208) = 0;
    }
    else {
      iVar2 = strcmp(in_RSI,"MaxC");
      if (iVar2 == 0) {
        *(undefined4 *)(lVar1 + 0x208) = 1;
      }
      else {
        iVar2 = strcmp(in_RSI,"MinC");
        if (iVar2 == 0) {
          *(undefined4 *)(lVar1 + 0x208) = 2;
        }
        else {
          iVar2 = strcmp(in_RSI,"MaxDiff");
          if (iVar2 == 0) {
            *(undefined4 *)(lVar1 + 0x208) = 3;
          }
          else {
            iVar2 = strcmp(in_RSI,"Prob");
            if (iVar2 == 0) {
              *(undefined4 *)(lVar1 + 0x208) = 4;
            }
            else {
              iVar2 = strcmp(in_RSI,"Basis");
              if (iVar2 == 0) {
                *(undefined4 *)(lVar1 + 0x208) = 5;
              }
              else {
                iVar2 = strcmp(in_RSI,"CMaxC");
                if (iVar2 == 0) {
                  *(undefined4 *)(lVar1 + 0x208) = 6;
                }
                else {
                  iVar2 = strcmp(in_RSI,"CMinC");
                  if (iVar2 == 0) {
                    *(undefined4 *)(lVar1 + 0x208) = 7;
                  }
                  else {
                    iVar2 = strcmp(in_RSI,"CMaxDiff");
                    if (iVar2 != 0) {
                      return 7;
                    }
                    *(undefined4 *)(lVar1 + 0x208) = 8;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    if (in_EDI != 3) {
      return 7;
    }
    *(undefined1 *)(lVar1 + 0x20d) = 0;
  }
  return 0;
}

Assistant:

error_t
BNB_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
    case BNB_KEEPALL:
        theArgumentsStruc->BnB_keepAll = true;
        break;
    case BNB_TYPE:
        if(strcmp(arg,"Id")==0)
            theArgumentsStruc->BnBJointTypeOrdering = IdentityMapping;
        else if(strcmp(arg,"MaxC")==0)
            theArgumentsStruc->BnBJointTypeOrdering = MaxContribution;
        else if(strcmp(arg,"MinC")==0)
            theArgumentsStruc->BnBJointTypeOrdering = MinContribution;
        else if(strcmp(arg,"MaxDiff")==0)
            theArgumentsStruc->BnBJointTypeOrdering = MaxContributionDifference;
        else if(strcmp(arg,"Prob")==0)
            theArgumentsStruc->BnBJointTypeOrdering = DescendingProbability;
        else if(strcmp(arg,"Basis")==0)
            theArgumentsStruc->BnBJointTypeOrdering = BasisTypes;
        else if(strcmp(arg,"CMaxC")==0)
            theArgumentsStruc->BnBJointTypeOrdering = ConsistentMaxContribution;
        else if(strcmp(arg,"CMinC")==0)
            theArgumentsStruc->BnBJointTypeOrdering = ConsistentMinContribution;
        else if(strcmp(arg,"CMaxDiff")==0)
            theArgumentsStruc->BnBJointTypeOrdering = ConsistentMaxContributionDifference;
        else
            return ARGP_ERR_UNKNOWN;
        break;
    case BNB_RECOMPUTE:
        theArgumentsStruc->BnB_consistentCompleteInformationHeur = false;
        break;
    default:
        return ARGP_ERR_UNKNOWN;
    }
    return 0;
}